

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_write_compressed_img
              (fitsfile *fptr,int datatype,long *infpixel,long *inlpixel,int nullcheck,void *array,
              void *nullval,int *status)

{
  int iVar1;
  char *tile;
  long tilelen;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  char local_358 [8];
  char card [81];
  char *bnullarray;
  void *buffer;
  int buffpixsiz;
  int tstatus;
  int tilenul;
  int pixlen;
  int ndim;
  int ii;
  long ntrows;
  long trowsize;
  long irow;
  long i0;
  long i1;
  long i2;
  long i3;
  long i4;
  long i5;
  long lpixel [6];
  long fpixel [6];
  long local_220;
  long ntemp;
  long offset [6];
  long rowdim [6];
  long tlpixel [6];
  long tfpixel [6];
  long ltile [6];
  long ftile [6];
  long thistilesize [6];
  long tilesize [6];
  long naxis [6];
  int tiledim [6];
  void *array_local;
  int nullcheck_local;
  long *inlpixel_local;
  long *infpixel_local;
  int datatype_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    iVar1 = fits_is_compressed_image(fptr,status);
    if (iVar1 == 0) {
      ffpmsg("CHDU is not a compressed image (fits_write_compressed_img)");
      *status = 0x19d;
      fptr_local._4_4_ = 0x19d;
    }
    else {
      if (fptr->HDUposition == fptr->Fptr->curhdu) {
        if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1)) {
          return *status;
        }
      }
      else {
        ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      }
      if ((datatype == 0x15) || (datatype == 0x14)) {
        tstatus = 2;
      }
      else if ((datatype == 0x1f) || (datatype == 0x1e)) {
        tstatus = 4;
      }
      else if ((datatype == 0xb) || (datatype == 0xc)) {
        tstatus = 1;
      }
      else if ((datatype == 0x29) || (datatype == 0x28)) {
        tstatus = 8;
      }
      else if (datatype == 0x2a) {
        tstatus = 4;
      }
      else {
        if (datatype != 0x52) {
          ffpmsg("unsupported datatype for compressing image");
          *status = 0x19a;
          return 0x19a;
        }
        tstatus = 8;
      }
      buffer._0_4_ = tstatus;
      if (fptr->Fptr->compress_type == 0x29) {
        if ((fptr->Fptr->zbitpix == 8) || (fptr->Fptr->zbitpix == 0x10)) {
          if ((uint)tstatus < 5) {
            local_35c = 4;
          }
          else {
            local_35c = tstatus;
          }
          buffer._0_4_ = local_35c;
        }
        else {
          buffer._0_4_ = 8;
        }
      }
      else if (fptr->Fptr->compress_type == 0x1f) {
        if ((uint)tstatus < 5) {
          local_360 = 4;
        }
        else {
          local_360 = tstatus;
        }
        buffer._0_4_ = local_360;
      }
      else {
        if ((((fptr->Fptr->compress_type != 0xb) && (fptr->Fptr->compress_type != 0x15)) &&
            (fptr->Fptr->compress_type != 0x16)) && (fptr->Fptr->compress_type != 0x33)) {
          ffpmsg("unsupported image compression algorithm");
          *status = 0x19a;
          return 0x19a;
        }
        if (fptr->Fptr->zbitpix == 8) {
          if ((uint)tstatus < 2) {
            local_364 = 1;
          }
          else {
            local_364 = tstatus;
          }
          buffer._0_4_ = local_364;
        }
        else if (fptr->Fptr->zbitpix == 0x10) {
          if ((uint)tstatus < 3) {
            local_368 = 2;
          }
          else {
            local_368 = tstatus;
          }
          buffer._0_4_ = local_368;
        }
        else {
          if ((uint)tstatus < 5) {
            local_36c = 4;
          }
          else {
            local_36c = tstatus;
          }
          buffer._0_4_ = local_36c;
        }
      }
      tile = (char *)calloc(fptr->Fptr->maxtilelen,(long)(int)buffer);
      if (tile == (char *)0x0) {
        ffpmsg("Out of memory (fits_write_compress_img)");
        *status = 0x71;
        fptr_local._4_4_ = 0x71;
      }
      else {
        for (pixlen = 0; pixlen < 6; pixlen = pixlen + 1) {
          tilesize[(long)pixlen + 5] = 1;
          tiledim[(long)pixlen + -2] = 1;
          thistilesize[(long)pixlen + 5] = 1;
          ltile[(long)pixlen + 5] = 1;
          tfpixel[(long)pixlen + 5] = 1;
          offset[(long)pixlen + 5] = 1;
        }
        tilenul = fptr->Fptr->zndim;
        local_220 = 1;
        for (pixlen = 0; pixlen < tilenul; pixlen = pixlen + 1) {
          lpixel[(long)pixlen + 5] = infpixel[pixlen];
          lpixel[(long)pixlen + -1] = inlpixel[pixlen];
          tilesize[(long)pixlen + 5] = fptr->Fptr->znaxis[pixlen];
          if (lpixel[(long)pixlen + 5] < 1) {
            free(tile);
            *status = 0x141;
            return 0x141;
          }
          thistilesize[(long)pixlen + 5] = fptr->Fptr->tilesize[pixlen];
          tiledim[(long)pixlen + -2] =
               (int)((tilesize[(long)pixlen + 5] + -1) / thistilesize[(long)pixlen + 5]) + 1;
          ltile[(long)pixlen + 5] =
               (lpixel[(long)pixlen + 5] + -1) / thistilesize[(long)pixlen + 5] + 1;
          if ((lpixel[(long)pixlen + -1] + -1) / thistilesize[(long)pixlen + 5] + 1 <
              (long)tiledim[(long)pixlen + -2]) {
            local_378 = (lpixel[(long)pixlen + -1] + -1) / thistilesize[(long)pixlen + 5] + 1;
          }
          else {
            local_378 = (long)tiledim[(long)pixlen + -2];
          }
          tfpixel[(long)pixlen + 5] = local_378;
          offset[(long)pixlen + 5] = local_220;
          local_220 = tiledim[(long)pixlen + -2] * local_220;
        }
        for (i4 = ftile[4]; i4 <= ltile[4]; i4 = i4 + 1) {
          tfpixel[4] = (i4 + -1) * tilesize[4] + 1;
          if (tfpixel[4] + tilesize[4] + -1 < naxis[4]) {
            local_380 = tfpixel[4] + tilesize[4] + -1;
          }
          else {
            local_380 = naxis[4];
          }
          tlpixel[4] = local_380;
          thistilesize[4] = (local_380 - tfpixel[4]) + 1;
          offset[4] = (i4 + -1) * rowdim[4];
          for (i3 = ftile[3]; i3 <= ltile[3]; i3 = i3 + 1) {
            tfpixel[3] = (i3 + -1) * tilesize[3] + 1;
            if (tfpixel[3] + tilesize[3] + -1 < naxis[3]) {
              local_388 = tfpixel[3] + tilesize[3] + -1;
            }
            else {
              local_388 = naxis[3];
            }
            tlpixel[3] = local_388;
            thistilesize[3] = thistilesize[4] * ((local_388 - tfpixel[3]) + 1);
            offset[3] = (i3 + -1) * rowdim[3] + offset[4];
            for (i2 = ftile[2]; i2 <= ltile[2]; i2 = i2 + 1) {
              tfpixel[2] = (i2 + -1) * tilesize[2] + 1;
              if (tfpixel[2] + tilesize[2] + -1 < naxis[2]) {
                local_390 = tfpixel[2] + tilesize[2] + -1;
              }
              else {
                local_390 = naxis[2];
              }
              tlpixel[2] = local_390;
              thistilesize[2] = thistilesize[3] * ((local_390 - tfpixel[2]) + 1);
              offset[2] = (i2 + -1) * rowdim[2] + offset[3];
              for (i1 = ftile[1]; i1 <= ltile[1]; i1 = i1 + 1) {
                tfpixel[1] = (i1 + -1) * tilesize[1] + 1;
                if (tfpixel[1] + tilesize[1] + -1 < naxis[1]) {
                  local_398 = tfpixel[1] + tilesize[1] + -1;
                }
                else {
                  local_398 = naxis[1];
                }
                tlpixel[1] = local_398;
                thistilesize[1] = thistilesize[2] * ((local_398 - tfpixel[1]) + 1);
                offset[1] = (i1 + -1) * rowdim[1] + offset[2];
                for (i0 = ftile[0]; i0 <= ltile[0]; i0 = i0 + 1) {
                  tfpixel[0] = (i0 + -1) * tilesize[0] + 1;
                  if (tfpixel[0] + tilesize[0] + -1 < naxis[0]) {
                    local_3a0 = tfpixel[0] + tilesize[0] + -1;
                  }
                  else {
                    local_3a0 = naxis[0];
                  }
                  tlpixel[0] = local_3a0;
                  thistilesize[0] = thistilesize[1] * ((local_3a0 - tfpixel[0]) + 1);
                  offset[0] = (i0 + -1) * rowdim[0] + offset[1];
                  for (irow = ltile[5]; irow <= tfpixel[5]; irow = irow + 1) {
                    tlpixel[5] = (irow + -1) * thistilesize[5] + 1;
                    if (tlpixel[5] + thistilesize[5] + -1 < tilesize[5]) {
                      local_3a8 = tlpixel[5] + thistilesize[5] + -1;
                    }
                    else {
                      local_3a8 = tilesize[5];
                    }
                    rowdim[5] = local_3a8;
                    tilelen = thistilesize[0] * ((local_3a8 - tlpixel[5]) + 1);
                    trowsize = irow + offset[0];
                    imcomp_decompress_tile
                              (fptr,(int)trowsize,(int)tilelen,datatype,nullcheck,nullval,tile,
                               (char *)0x0,&buffpixsiz,status);
                    if (*status == 0x19f) {
                      memset(tile,0,tstatus * tilelen);
                      *status = 0;
                    }
                    imcomp_merge_overlap
                              (tile,tstatus,tilenul,tlpixel + 5,rowdim + 5,(char *)0x0,(char *)array
                               ,lpixel + 5,&i5,nullcheck,status);
                    fits_calc_tile_rows(rowdim + 5,tlpixel + 5,tilenul,&ntrows,(long *)&ndim,status)
                    ;
                    imcomp_compress_tile
                              (fptr,trowsize,datatype,tile,tilelen,ntrows,_ndim,nullcheck,nullval,
                               status);
                  }
                }
              }
            }
          }
        }
        free(tile);
        if ((fptr->Fptr->zbitpix < 0) && (nullcheck != 0)) {
          buffer._4_4_ = 0;
          ffgcrd(fptr,"ZBLANK",local_358,(int *)((long)&buffer + 4));
          if (buffer._4_4_ != 0) {
            ffgcrd(fptr,"ZCMPTYPE",local_358,status);
            ffikyj(fptr,"ZBLANK",-0x7fffffff,"null value in the compressed integer array",status);
            fptr->Fptr->zblank = -0x7fffffff;
            fptr->Fptr->cn_zblank = -1;
          }
        }
        fptr_local._4_4_ = *status;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_write_compressed_img(fitsfile *fptr,   /* I - FITS file pointer     */
            int  datatype,   /* I - datatype of the array to be written      */
            long  *infpixel, /* I - 'bottom left corner' of the subsection   */
            long  *inlpixel, /* I - 'top right corner' of the subsection     */
            int  nullcheck,  /* I - 0 for no null checking                   */
                             /*     1: pixels that are = nullval will be     */
                             /*     written with the FITS null pixel value   */
                             /*     (floating point arrays only)             */
            void *array,     /* I - array of values to be written            */
            void *nullval,   /* I - undefined pixel value                    */
            int  *status)    /* IO - error status                            */
/*
   Write a section of a compressed image.
*/
{
    int  tiledim[MAX_COMPRESS_DIM];
    long naxis[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM], thistilesize[MAX_COMPRESS_DIM];
    long ftile[MAX_COMPRESS_DIM], ltile[MAX_COMPRESS_DIM];
    long tfpixel[MAX_COMPRESS_DIM], tlpixel[MAX_COMPRESS_DIM];
    long rowdim[MAX_COMPRESS_DIM], offset[MAX_COMPRESS_DIM],ntemp;
    long fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long i5, i4, i3, i2, i1, i0, irow, trowsize, ntrows;
    int ii, ndim, pixlen, tilenul;
    int  tstatus, buffpixsiz;
    void *buffer;
    char *bnullarray = 0, card[FLEN_CARD];

    if (*status > 0) 
        return(*status);

    if (!fits_is_compressed_image(fptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_write_compressed_img)");
        return(*status = DATA_COMPRESSION_ERR);
    }

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);


    /* ===================================================================== */


    if (datatype == TSHORT || datatype == TUSHORT)
    {
       pixlen = sizeof(short);
    }
    else if (datatype == TINT || datatype == TUINT)
    {
       pixlen = sizeof(int);
    }
    else if (datatype == TBYTE || datatype == TSBYTE)
    {
       pixlen = 1;
    }
    else if (datatype == TLONG || datatype == TULONG)
    {
       pixlen = sizeof(long);
    }
    else if (datatype == TFLOAT)
    {
       pixlen = sizeof(float);
    }
    else if (datatype == TDOUBLE)
    {
       pixlen = sizeof(double);
    }
    else
    {
        ffpmsg("unsupported datatype for compressing image");
        return(*status = BAD_DATATYPE);
    }

    /* ===================================================================== */

    /* allocate scratch space for processing one tile of the image */
    buffpixsiz = pixlen;  /* this is the minimum pixel size */
    
    if ( (fptr->Fptr)->compress_type == HCOMPRESS_1) { /* need 4 or 8 bytes per pixel */
        if ((fptr->Fptr)->zbitpix == BYTE_IMG ||
	    (fptr->Fptr)->zbitpix == SHORT_IMG )
                buffpixsiz = maxvalue(buffpixsiz, 4);
        else
	        buffpixsiz = 8;
    }
    else if ( (fptr->Fptr)->compress_type == PLIO_1) { /* need 4 bytes per pixel */
                buffpixsiz = maxvalue(buffpixsiz, 4);
    }
    else if ( (fptr->Fptr)->compress_type == RICE_1  ||
              (fptr->Fptr)->compress_type == GZIP_1 ||
              (fptr->Fptr)->compress_type == GZIP_2 ||
              (fptr->Fptr)->compress_type == BZIP2_1) {  /* need 1, 2, or 4 bytes per pixel */
        if ((fptr->Fptr)->zbitpix == BYTE_IMG)
            buffpixsiz = maxvalue(buffpixsiz, 1);
        else if ((fptr->Fptr)->zbitpix == SHORT_IMG)
            buffpixsiz = maxvalue(buffpixsiz, 2);
        else 
            buffpixsiz = maxvalue(buffpixsiz, 4);
    }
    else
    {
        ffpmsg("unsupported image compression algorithm");
        return(*status = BAD_DATATYPE);
    }
    
    /* cast to double to force alignment on 8-byte addresses */
    buffer = (double *) calloc ((fptr->Fptr)->maxtilelen, buffpixsiz);

    if (buffer == NULL)
    {
	    ffpmsg("Out of memory (fits_write_compress_img)");
	    return (*status = MEMORY_ALLOCATION);
    }

    /* ===================================================================== */

    /* initialize all the arrays */
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxis[ii] = 1;
        tiledim[ii] = 1;
        tilesize[ii] = 1;
        ftile[ii] = 1;
        ltile[ii] = 1;
        rowdim[ii] = 1;
    }

    ndim = (fptr->Fptr)->zndim;
    ntemp = 1;
    for (ii = 0; ii < ndim; ii++)
    {
        fpixel[ii] = infpixel[ii];
        lpixel[ii] = inlpixel[ii];

        /* calc number of tiles in each dimension, and tile containing */
        /* the first and last pixel we want to read in each dimension  */
        naxis[ii] = (fptr->Fptr)->znaxis[ii];
        if (fpixel[ii] < 1)
        {
            free(buffer);
            return(*status = BAD_PIX_NUM);
        }

        tilesize[ii] = (fptr->Fptr)->tilesize[ii];
        tiledim[ii] = (naxis[ii] - 1) / tilesize[ii] + 1;
        ftile[ii]   = (fpixel[ii] - 1)   / tilesize[ii] + 1;
        ltile[ii]   = minvalue((lpixel[ii] - 1) / tilesize[ii] + 1, 
                                tiledim[ii]);
        rowdim[ii]  = ntemp;  /* total tiles in each dimension */
        ntemp *= tiledim[ii];
    }

    /* support up to 6 dimensions for now */
    /* tfpixel and tlpixel are the first and last image pixels */
    /* along each dimension of the compression tile */
    for (i5 = ftile[5]; i5 <= ltile[5]; i5++)
    {
     tfpixel[5] = (i5 - 1) * tilesize[5] + 1;
     tlpixel[5] = minvalue(tfpixel[5] + tilesize[5] - 1, 
                            naxis[5]);
     thistilesize[5] = tlpixel[5] - tfpixel[5] + 1;
     offset[5] = (i5 - 1) * rowdim[5];
     for (i4 = ftile[4]; i4 <= ltile[4]; i4++)
     {
      tfpixel[4] = (i4 - 1) * tilesize[4] + 1;
      tlpixel[4] = minvalue(tfpixel[4] + tilesize[4] - 1, 
                            naxis[4]);
      thistilesize[4] = thistilesize[5] * (tlpixel[4] - tfpixel[4] + 1);
      offset[4] = (i4 - 1) * rowdim[4] + offset[5];
      for (i3 = ftile[3]; i3 <= ltile[3]; i3++)
      {
        tfpixel[3] = (i3 - 1) * tilesize[3] + 1;
        tlpixel[3] = minvalue(tfpixel[3] + tilesize[3] - 1, 
                              naxis[3]);
        thistilesize[3] = thistilesize[4] * (tlpixel[3] - tfpixel[3] + 1);
        offset[3] = (i3 - 1) * rowdim[3] + offset[4];
        for (i2 = ftile[2]; i2 <= ltile[2]; i2++)
        {
          tfpixel[2] = (i2 - 1) * tilesize[2] + 1;
          tlpixel[2] = minvalue(tfpixel[2] + tilesize[2] - 1, 
                                naxis[2]);
          thistilesize[2] = thistilesize[3] * (tlpixel[2] - tfpixel[2] + 1);
          offset[2] = (i2 - 1) * rowdim[2] + offset[3];
          for (i1 = ftile[1]; i1 <= ltile[1]; i1++)
          {
            tfpixel[1] = (i1 - 1) * tilesize[1] + 1;
            tlpixel[1] = minvalue(tfpixel[1] + tilesize[1] - 1, 
                                  naxis[1]);
            thistilesize[1] = thistilesize[2] * (tlpixel[1] - tfpixel[1] + 1);
            offset[1] = (i1 - 1) * rowdim[1] + offset[2];
            for (i0 = ftile[0]; i0 <= ltile[0]; i0++)
            {
              tfpixel[0] = (i0 - 1) * tilesize[0] + 1;
              tlpixel[0] = minvalue(tfpixel[0] + tilesize[0] - 1, 
                                    naxis[0]);
              thistilesize[0] = thistilesize[1] * (tlpixel[0] - tfpixel[0] + 1);
              /* calculate row of table containing this tile */
              irow = i0 + offset[1];

              /* read and uncompress this row (tile) of the table */
              /* also do type conversion and undefined pixel substitution */
              /* at this point */
              imcomp_decompress_tile(fptr, irow, thistilesize[0],
                    datatype, nullcheck, nullval, buffer, bnullarray, &tilenul,
                     status);

              if (*status == NO_COMPRESSED_TILE)
              {
                   /* tile doesn't exist, so initialize to zero */
                   memset(buffer, 0, pixlen * thistilesize[0]);
                   *status = 0;
              }

              /* copy the intersecting pixels to this tile from the input */
              imcomp_merge_overlap(buffer, pixlen, ndim, tfpixel, tlpixel, 
                     bnullarray, array, fpixel, lpixel, nullcheck, status);
                     
             /* Collapse sizes of higher dimension tiles into 2 dimensional
                equivalents needed by the quantizing algorithms for
                floating point types */
              fits_calc_tile_rows(tlpixel, tfpixel, ndim, &trowsize,
                              &ntrows, status);

              /* compress the tile again, and write it back to the FITS file */
              imcomp_compress_tile (fptr, irow, datatype, buffer, 
                                    thistilesize[0],
				    trowsize,
				    ntrows,
				    nullcheck, nullval, 
				    status);
            }
          }
        }
      }
     }
    }
    free(buffer);
    

    if ((fptr->Fptr)->zbitpix < 0 && nullcheck != 0) { 
/*
     This is a floating point FITS image with possible null values.
     It is too messy to test if any null values are actually written, so 
     just assume so.  We need to make sure that the
     ZBLANK keyword is present in the compressed image header.  If it is not
     there then we need to insert the keyword. 
*/   
        tstatus = 0;
        ffgcrd(fptr, "ZBLANK", card, &tstatus);

	if (tstatus) {   /* have to insert the ZBLANK keyword */
           ffgcrd(fptr, "ZCMPTYPE", card, status);
           ffikyj(fptr, "ZBLANK", COMPRESS_NULL_VALUE, 
                "null value in the compressed integer array", status);
	
           /* set this value into the internal structure; it is used if */
	   /* the program reads back the values from the array */
	 
          (fptr->Fptr)->zblank = COMPRESS_NULL_VALUE;
          (fptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */
        }  
    }  
    
    return(*status);
}